

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::namedItemNS
          (QDomNamedNodeMapPrivate *this,QString *nsURI,QString *localName)

{
  bool bVar1;
  QDomNodePrivate **ppQVar2;
  QMultiHash<QString,_QDomNodePrivate_*> *in_RSI;
  long in_FS_OFFSET;
  QDomNodePrivate *n;
  const_iterator it;
  QString *in_stack_ffffffffffffff88;
  QMultiHash<QString,_QDomNodePrivate_*> *in_stack_ffffffffffffff90;
  QDomNodePrivate *local_40;
  const_iterator local_38;
  const_iterator local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  local_20.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QString,_QDomNodePrivate_*>::constBegin(in_RSI);
  while( true ) {
    QMultiHash<QString,_QDomNodePrivate_*>::constEnd(in_stack_ffffffffffffff90);
    bVar1 = QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    ppQVar2 = QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::value(&local_20);
    local_40 = *ppQVar2;
    bVar1 = QString::isNull((QString *)0x112748);
    if (((!bVar1) &&
        (bVar1 = operator==((QString *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88), bVar1))
       && (bVar1 = operator==((QString *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88), bVar1
          )) goto LAB_001127a9;
    QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator++((const_iterator *)local_40);
  }
  local_40 = (QDomNodePrivate *)0x0;
LAB_001127a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::namedItemNS(const QString& nsURI, const QString& localName) const
{
    auto it = map.constBegin();
    QDomNodePrivate *n;
    for (; it != map.constEnd(); ++it) {
        n = it.value();
        if (!n->prefix.isNull()) {
            // node has a namespace
            if (n->namespaceURI == nsURI && n->name == localName)
                return n;
        }
    }
    return nullptr;
}